

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiener_test.cc
# Opt level: O3

void __thiscall
wiener_highbd::SearchWienerTest_DISABLED_12bitSignedIntegerOverflowInLinsolveWiener2_Test::TestBody
          (SearchWienerTest_DISABLED_12bitSignedIntegerOverflowInLinsolveWiener2_Test *this)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  aom_codec_err_t aVar3;
  aom_codec_iface_t *iface;
  SEARCH_METHODS *pSVar4;
  aom_codec_iter_t iter;
  aom_codec_cx_pkt_t *pkt;
  aom_codec_ctx_t enc;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_4b0;
  AssertHelper local_4a8;
  AssertHelper local_4a0;
  undefined8 *local_498;
  AssertHelper local_490;
  AssertHelper local_488;
  aom_codec_ctx_t local_480;
  undefined1 local_448 [16];
  int local_438;
  uchar *local_400;
  uchar *puStack_3f8;
  int local_3ec [19];
  aom_codec_enc_cfg_t local_3a0;
  
  iface = aom_codec_av1_cx();
  local_480.name._0_4_ = 0;
  local_4a0.data_._0_4_ = aom_codec_enc_config_default(iface,&local_3a0,0);
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)local_448,"AOM_CODEC_OK","aom_codec_enc_config_default(iface, &cfg, 0u)",
             (aom_codec_err_t *)&local_480,(aom_codec_err_t *)&local_4a0);
  if (local_448[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_480);
    if ((undefined8 *)local_448._8_8_ == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = *(SEARCH_METHODS **)local_448._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
               ,0x859,(char *)pSVar4);
    testing::internal::AssertHelper::operator=(&local_4a0,(Message *)&local_480);
    testing::internal::AssertHelper::~AssertHelper(&local_4a0);
    if ((long *)CONCAT44(local_480.name._4_4_,local_480.name._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_480.name._4_4_,local_480.name._0_4_) + 8))();
    }
  }
  uVar2 = local_448._8_8_;
  if ((undefined8 *)local_448._8_8_ != (undefined8 *)0x0) {
    if (*(undefined8 **)local_448._8_8_ != (undefined8 *)(local_448._8_8_ + 0x10)) {
      operator_delete(*(undefined8 **)local_448._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_3a0.rc_end_usage = AOM_Q;
  local_3a0.g_bit_depth = AOM_BITS_12;
  local_3a0.g_input_bit_depth = 0xc;
  local_3a0.g_lag_in_frames = 0;
  local_3a0.g_threads = 0x20;
  local_3a0.g_profile = 2;
  local_3a0.g_w = 4;
  local_3a0.g_h = 2;
  local_3a0.monochrome = 1;
  local_3a0.rc_min_quantizer = 0x33;
  local_3a0.rc_max_quantizer = 0x37;
  local_4a0.data_._0_4_ = 0;
  local_490.data_._0_4_ = aom_codec_enc_init_ver(&local_480,iface,&local_3a0,0x40000,0x1d);
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)local_448,"AOM_CODEC_OK",
             "aom_codec_enc_init_ver(&enc, iface, &cfg, 0x40000, (10 + (7 + (9)) + 3))",
             (aom_codec_err_t *)&local_4a0,(aom_codec_err_t *)&local_490);
  if (local_448[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_4a0);
    if ((undefined8 *)local_448._8_8_ == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = *(SEARCH_METHODS **)local_448._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
               ,0x867,(char *)pSVar4);
    testing::internal::AssertHelper::operator=(&local_490,(Message *)&local_4a0);
    testing::internal::AssertHelper::~AssertHelper(&local_490);
    if ((long *)CONCAT44(local_4a0.data_._4_4_,(aom_codec_err_t)local_4a0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_4a0.data_._4_4_,(aom_codec_err_t)local_4a0.data_) + 8))()
      ;
    }
  }
  uVar2 = local_448._8_8_;
  if ((undefined8 *)local_448._8_8_ != (undefined8 *)0x0) {
    if (*(undefined8 **)local_448._8_8_ != (undefined8 *)(local_448._8_8_ + 0x10)) {
      operator_delete(*(undefined8 **)local_448._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_4a0.data_._0_4_ = 0;
  aVar3 = aom_codec_control(&local_480,0x19,0x35);
  local_490.data_._0_4_ = aVar3;
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)local_448,"AOM_CODEC_OK","aom_codec_control(&enc, AOME_SET_CQ_LEVEL, 53)",
             (aom_codec_err_t *)&local_4a0,(aom_codec_err_t *)&local_490);
  if (local_448[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_4a0);
    if ((undefined8 *)local_448._8_8_ == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = *(SEARCH_METHODS **)local_448._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
               ,0x868,(char *)pSVar4);
    testing::internal::AssertHelper::operator=(&local_490,(Message *)&local_4a0);
    testing::internal::AssertHelper::~AssertHelper(&local_490);
    if ((long *)CONCAT44(local_4a0.data_._4_4_,(aom_codec_err_t)local_4a0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_4a0.data_._4_4_,(aom_codec_err_t)local_4a0.data_) + 8))()
      ;
    }
  }
  uVar2 = local_448._8_8_;
  if ((undefined8 *)local_448._8_8_ != (undefined8 *)0x0) {
    if (*(undefined8 **)local_448._8_8_ != (undefined8 *)(local_448._8_8_ + 0x10)) {
      operator_delete(*(undefined8 **)local_448._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_4a0.data_._0_4_ = 0;
  aVar3 = aom_codec_control(&local_480,0x22,3);
  local_490.data_._0_4_ = aVar3;
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)local_448,"AOM_CODEC_OK","aom_codec_control(&enc, AV1E_SET_TILE_ROWS, 3)",
             (aom_codec_err_t *)&local_4a0,(aom_codec_err_t *)&local_490);
  if (local_448[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_4a0);
    if ((undefined8 *)local_448._8_8_ == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = *(SEARCH_METHODS **)local_448._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
               ,0x869,(char *)pSVar4);
    testing::internal::AssertHelper::operator=(&local_490,(Message *)&local_4a0);
    testing::internal::AssertHelper::~AssertHelper(&local_490);
    if ((long *)CONCAT44(local_4a0.data_._4_4_,(aom_codec_err_t)local_4a0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_4a0.data_._4_4_,(aom_codec_err_t)local_4a0.data_) + 8))()
      ;
    }
  }
  uVar2 = local_448._8_8_;
  if ((undefined8 *)local_448._8_8_ != (undefined8 *)0x0) {
    if (*(undefined8 **)local_448._8_8_ != (undefined8 *)(local_448._8_8_ + 0x10)) {
      operator_delete(*(undefined8 **)local_448._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_4a0.data_._0_4_ = 0;
  aVar3 = aom_codec_control(&local_480,0x21,6);
  local_490.data_._0_4_ = aVar3;
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)local_448,"AOM_CODEC_OK",
             "aom_codec_control(&enc, AV1E_SET_TILE_COLUMNS, 6)",(aom_codec_err_t *)&local_4a0,
             (aom_codec_err_t *)&local_490);
  if (local_448[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_4a0);
    if ((undefined8 *)local_448._8_8_ == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = *(SEARCH_METHODS **)local_448._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
               ,0x86a,(char *)pSVar4);
    testing::internal::AssertHelper::operator=(&local_490,(Message *)&local_4a0);
    testing::internal::AssertHelper::~AssertHelper(&local_490);
    if ((long *)CONCAT44(local_4a0.data_._4_4_,(aom_codec_err_t)local_4a0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_4a0.data_._4_4_,(aom_codec_err_t)local_4a0.data_) + 8))()
      ;
    }
  }
  uVar2 = local_448._8_8_;
  if ((undefined8 *)local_448._8_8_ != (undefined8 *)0x0) {
    if (*(undefined8 **)local_448._8_8_ != (undefined8 *)(local_448._8_8_ + 0x10)) {
      operator_delete(*(undefined8 **)local_448._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_4a0.data_._0_4_ = 0;
  aVar3 = aom_codec_control(&local_480,0xd,6);
  local_490.data_._0_4_ = aVar3;
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)local_448,"AOM_CODEC_OK","aom_codec_control(&enc, AOME_SET_CPUUSED, 6)",
             (aom_codec_err_t *)&local_4a0,(aom_codec_err_t *)&local_490);
  if (local_448[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_4a0);
    if ((undefined8 *)local_448._8_8_ == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = *(SEARCH_METHODS **)local_448._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
               ,0x86b,(char *)pSVar4);
    testing::internal::AssertHelper::operator=(&local_490,(Message *)&local_4a0);
    testing::internal::AssertHelper::~AssertHelper(&local_490);
    if ((long *)CONCAT44(local_4a0.data_._4_4_,(aom_codec_err_t)local_4a0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_4a0.data_._4_4_,(aom_codec_err_t)local_4a0.data_) + 8))()
      ;
    }
  }
  uVar2 = local_448._8_8_;
  if ((undefined8 *)local_448._8_8_ != (undefined8 *)0x0) {
    if (*(undefined8 **)local_448._8_8_ != (undefined8 *)(local_448._8_8_ + 0x10)) {
      operator_delete(*(undefined8 **)local_448._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_4a0.data_._0_4_ = 0;
  aVar3 = aom_codec_control(&local_480,0x34,1);
  local_490.data_._0_4_ = aVar3;
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)local_448,"AOM_CODEC_OK",
             "aom_codec_control(&enc, AV1E_SET_COLOR_RANGE, AOM_CR_FULL_RANGE)",
             (aom_codec_err_t *)&local_4a0,(aom_codec_err_t *)&local_490);
  if (local_448[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_4a0);
    if ((undefined8 *)local_448._8_8_ == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = *(SEARCH_METHODS **)local_448._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
               ,0x86d,(char *)pSVar4);
    testing::internal::AssertHelper::operator=(&local_490,(Message *)&local_4a0);
    testing::internal::AssertHelper::~AssertHelper(&local_490);
    if ((long *)CONCAT44(local_4a0.data_._4_4_,(aom_codec_err_t)local_4a0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_4a0.data_._4_4_,(aom_codec_err_t)local_4a0.data_) + 8))()
      ;
    }
  }
  uVar2 = local_448._8_8_;
  if ((undefined8 *)local_448._8_8_ != (undefined8 *)0x0) {
    if (*(undefined8 **)local_448._8_8_ != (undefined8 *)(local_448._8_8_ + 0x10)) {
      operator_delete(*(undefined8 **)local_448._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_4a0.data_._0_4_ = 0;
  aVar3 = aom_codec_control(&local_480,0x18,1);
  local_490.data_._0_4_ = aVar3;
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)local_448,"AOM_CODEC_OK",
             "aom_codec_control(&enc, AOME_SET_TUNING, AOM_TUNE_SSIM)",(aom_codec_err_t *)&local_4a0
             ,(aom_codec_err_t *)&local_490);
  if (local_448[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_4a0);
    if ((undefined8 *)local_448._8_8_ == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = *(SEARCH_METHODS **)local_448._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
               ,0x86f,(char *)pSVar4);
    testing::internal::AssertHelper::operator=(&local_490,(Message *)&local_4a0);
    testing::internal::AssertHelper::~AssertHelper(&local_490);
    if ((long *)CONCAT44(local_4a0.data_._4_4_,(aom_codec_err_t)local_4a0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_4a0.data_._4_4_,(aom_codec_err_t)local_4a0.data_) + 8))()
      ;
    }
  }
  if ((undefined8 *)local_448._8_8_ != (undefined8 *)0x0) {
    if (*(undefined8 **)local_448._8_8_ != (undefined8 *)(local_448._8_8_ + 0x10)) {
      operator_delete(*(undefined8 **)local_448._8_8_);
    }
    operator_delete((void *)local_448._8_8_);
  }
  local_490.data_ = (AssertHelperData *)local_448;
  local_488.data_ =
       (AssertHelperData *)
       aom_img_wrap((aom_image_t *)local_448,AOM_IMG_FMT_I42016,4,2,1,(uchar *)TestBody::kBuffer1);
  testing::internal::CmpHelperEQ<aom_image*,aom_image*>
            ((internal *)&local_4a0,"&img",
             "aom_img_wrap(&img, AOM_IMG_FMT_I42016, kWidth, kHeight, 1, img_data1)",
             (aom_image **)&local_490,(aom_image **)&local_488);
  if (local_4a0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_490);
    if (local_498 == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = (SEARCH_METHODS *)*local_498;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_488,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
               ,0x875,(char *)pSVar4);
    testing::internal::AssertHelper::operator=(&local_488,(Message *)&local_490);
    testing::internal::AssertHelper::~AssertHelper(&local_488);
    if ((aom_image_t *)local_490.data_ != (aom_image_t *)0x0) {
      (**(code **)(*(long *)local_490.data_ + 8))();
    }
  }
  puVar1 = local_498;
  if (local_498 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_498 != local_498 + 2) {
      operator_delete((undefined8 *)*local_498);
    }
    operator_delete(puVar1);
  }
  local_438 = 1;
  local_3ec[0] = 0;
  local_3ec[1] = 0;
  local_400 = (uchar *)0x0;
  puStack_3f8 = (uchar *)0x0;
  aVar3 = aom_codec_encode(&local_480,(aom_image_t *)local_448,0,1,0);
  local_490.data_._0_4_ = aVar3;
  local_488.data_ = local_488.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)&local_4a0,"aom_codec_encode(&enc, &img, 0, 1, 0)","AOM_CODEC_OK",
             (aom_codec_err_t *)&local_490,(aom_codec_err_t *)&local_488);
  if (local_4a0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_490);
    if (local_498 == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = (SEARCH_METHODS *)*local_498;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_488,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
               ,0x879,(char *)pSVar4);
    testing::internal::AssertHelper::operator=(&local_488,(Message *)&local_490);
    testing::internal::AssertHelper::~AssertHelper(&local_488);
    if (local_490.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_490.data_ + 8))();
    }
  }
  puVar1 = local_498;
  if (local_498 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_498 != local_498 + 2) {
      operator_delete((undefined8 *)*local_498);
    }
    operator_delete(puVar1);
  }
  local_490.data_ = (AssertHelperData *)0x0;
  local_488.data_ = (AssertHelperData *)aom_codec_get_cx_data(&local_480,&local_490.data_);
  local_4b0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<aom_codec_cx_pkt_const*,decltype(nullptr)>
            ((internal *)&local_4a0,"pkt","nullptr",(aom_codec_cx_pkt **)&local_488,
             &local_4b0._M_head_impl);
  puVar1 = local_498;
  if (local_4a0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_4b0);
    if (local_498 == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = (SEARCH_METHODS *)*local_498;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
               ,0x87c,(char *)pSVar4);
    testing::internal::AssertHelper::operator=(&local_4a8,(Message *)&local_4b0);
  }
  else {
    if (local_498 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_498 != local_498 + 2) {
        operator_delete((undefined8 *)*local_498);
      }
      operator_delete(puVar1);
    }
    local_4b0._M_head_impl = local_4b0._M_head_impl & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<aom_codec_cx_pkt_kind,aom_codec_cx_pkt_kind>
              ((internal *)&local_4a0,"pkt->kind","AOM_CODEC_CX_FRAME_PKT",&(local_488.data_)->type,
               (aom_codec_cx_pkt_kind *)&local_4b0);
    if (local_4a0.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_4b0);
      if (local_498 == (undefined8 *)0x0) {
        pSVar4 = "";
      }
      else {
        pSVar4 = (SEARCH_METHODS *)*local_498;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_4a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
                 ,0x87d,(char *)pSVar4);
      testing::internal::AssertHelper::operator=(&local_4a8,(Message *)&local_4b0);
      testing::internal::AssertHelper::~AssertHelper(&local_4a8);
      if (local_4b0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_4b0._M_head_impl + 8))();
      }
    }
    puVar1 = local_498;
    if (local_498 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_498 != local_498 + 2) {
        operator_delete((undefined8 *)*local_498);
      }
      operator_delete(puVar1);
    }
    local_4b0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (CONCAT44(local_4b0._M_head_impl._4_4_,*(undefined4 *)&((local_488.data_)->message).field_2
                  ) & 0xffffffff00000001);
    local_4a8.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&local_4a0,"pkt->data.frame.flags & 0x1u","0x1u",(uint *)&local_4b0,
               (uint *)&local_4a8);
    if (local_4a0.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_4b0);
      if (local_498 == (undefined8 *)0x0) {
        pSVar4 = "";
      }
      else {
        pSVar4 = (SEARCH_METHODS *)*local_498;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_4a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
                 ,0x87f,(char *)pSVar4);
      testing::internal::AssertHelper::operator=(&local_4a8,(Message *)&local_4b0);
      testing::internal::AssertHelper::~AssertHelper(&local_4a8);
      if (local_4b0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_4b0._M_head_impl + 8))();
      }
    }
    puVar1 = local_498;
    if (local_498 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_498 != local_498 + 2) {
        operator_delete((undefined8 *)*local_498);
      }
      operator_delete(puVar1);
    }
    local_488.data_ = (AssertHelperData *)aom_codec_get_cx_data(&local_480,&local_490.data_);
    local_4b0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::CmpHelperEQ<aom_codec_cx_pkt_const*,decltype(nullptr)>
              ((internal *)&local_4a0,"pkt","nullptr",(aom_codec_cx_pkt **)&local_488,
               &local_4b0._M_head_impl);
    if (local_4a0.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_4b0);
      if (local_498 == (undefined8 *)0x0) {
        pSVar4 = "";
      }
      else {
        pSVar4 = (SEARCH_METHODS *)*local_498;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_4a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
                 ,0x881,(char *)pSVar4);
      testing::internal::AssertHelper::operator=(&local_4a8,(Message *)&local_4b0);
      testing::internal::AssertHelper::~AssertHelper(&local_4a8);
      if (local_4b0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_4b0._M_head_impl + 8))();
      }
    }
    puVar1 = local_498;
    if (local_498 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_498 != local_498 + 2) {
        operator_delete((undefined8 *)*local_498);
      }
      operator_delete(puVar1);
    }
    local_4b0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448;
    local_4a8.data_ =
         (AssertHelperData *)
         aom_img_wrap((aom_image_t *)local_448,AOM_IMG_FMT_I42016,4,2,1,(uchar *)TestBody::kBuffer2)
    ;
    testing::internal::CmpHelperEQ<aom_image*,aom_image*>
              ((internal *)&local_4a0,"&img",
               "aom_img_wrap(&img, AOM_IMG_FMT_I42016, kWidth, kHeight, 1, img_data2)",
               (aom_image **)&local_4b0,(aom_image **)&local_4a8);
    if (local_4a0.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_4b0);
      if (local_498 == (undefined8 *)0x0) {
        pSVar4 = "";
      }
      else {
        pSVar4 = (SEARCH_METHODS *)*local_498;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_4a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
                 ,0x885,(char *)pSVar4);
      testing::internal::AssertHelper::operator=(&local_4a8,(Message *)&local_4b0);
      testing::internal::AssertHelper::~AssertHelper(&local_4a8);
      if ((aom_image_t *)local_4b0._M_head_impl != (aom_image_t *)0x0) {
        (**(code **)(*(long *)local_4b0._M_head_impl + 8))();
      }
    }
    puVar1 = local_498;
    if (local_498 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_498 != local_498 + 2) {
        operator_delete((undefined8 *)*local_498);
      }
      operator_delete(puVar1);
    }
    local_438 = 1;
    local_3ec[0] = 0;
    local_3ec[1] = 0;
    local_400 = (uchar *)0x0;
    puStack_3f8 = (uchar *)0x0;
    aVar3 = aom_codec_encode(&local_480,(aom_image_t *)local_448,0,1,0);
    local_4b0._M_head_impl._0_4_ = aVar3;
    local_4a8.data_ = local_4a8.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
              ((internal *)&local_4a0,"aom_codec_encode(&enc, &img, 0, 1, 0)","AOM_CODEC_OK",
               (aom_codec_err_t *)&local_4b0,(aom_codec_err_t *)&local_4a8);
    if (local_4a0.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_4b0);
      if (local_498 == (undefined8 *)0x0) {
        pSVar4 = "";
      }
      else {
        pSVar4 = (SEARCH_METHODS *)*local_498;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_4a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
                 ,0x889,(char *)pSVar4);
      testing::internal::AssertHelper::operator=(&local_4a8,(Message *)&local_4b0);
      testing::internal::AssertHelper::~AssertHelper(&local_4a8);
      if (local_4b0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_4b0._M_head_impl + 8))();
      }
    }
    puVar1 = local_498;
    if (local_498 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_498 != local_498 + 2) {
        operator_delete((undefined8 *)*local_498);
      }
      operator_delete(puVar1);
    }
    local_490.data_ = (AssertHelperData *)0x0;
    local_488.data_ = (AssertHelperData *)aom_codec_get_cx_data(&local_480,&local_490.data_);
    local_4b0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::CmpHelperNE<aom_codec_cx_pkt_const*,decltype(nullptr)>
              ((internal *)&local_4a0,"pkt","nullptr",(aom_codec_cx_pkt **)&local_488,
               &local_4b0._M_head_impl);
    puVar1 = local_498;
    if (local_4a0.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_4b0);
      if (local_498 == (undefined8 *)0x0) {
        pSVar4 = "";
      }
      else {
        pSVar4 = (SEARCH_METHODS *)*local_498;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_4a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
                 ,0x88c,(char *)pSVar4);
      testing::internal::AssertHelper::operator=(&local_4a8,(Message *)&local_4b0);
    }
    else {
      if (local_498 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_498 != local_498 + 2) {
          operator_delete((undefined8 *)*local_498);
        }
        operator_delete(puVar1);
      }
      local_4b0._M_head_impl = local_4b0._M_head_impl & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<aom_codec_cx_pkt_kind,aom_codec_cx_pkt_kind>
                ((internal *)&local_4a0,"pkt->kind","AOM_CODEC_CX_FRAME_PKT",
                 &(local_488.data_)->type,(aom_codec_cx_pkt_kind *)&local_4b0);
      if (local_4a0.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_4b0);
        if (local_498 == (undefined8 *)0x0) {
          pSVar4 = "";
        }
        else {
          pSVar4 = (SEARCH_METHODS *)*local_498;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_4a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
                   ,0x88d,(char *)pSVar4);
        testing::internal::AssertHelper::operator=(&local_4a8,(Message *)&local_4b0);
        testing::internal::AssertHelper::~AssertHelper(&local_4a8);
        if (local_4b0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_4b0._M_head_impl + 8))();
        }
      }
      puVar1 = local_498;
      if (local_498 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_498 != local_498 + 2) {
          operator_delete((undefined8 *)*local_498);
        }
        operator_delete(puVar1);
      }
      local_4b0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (CONCAT44(local_4b0._M_head_impl._4_4_,
                     *(undefined4 *)&((local_488.data_)->message).field_2) & 0xffffffff00000001);
      local_4a8.data_ = local_4a8.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&local_4a0,"pkt->data.frame.flags & 0x1u","0u",(uint *)&local_4b0,
                 (uint *)&local_4a8);
      if (local_4a0.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_4b0);
        if (local_498 == (undefined8 *)0x0) {
          pSVar4 = "";
        }
        else {
          pSVar4 = (SEARCH_METHODS *)*local_498;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_4a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
                   ,0x88f,(char *)pSVar4);
        testing::internal::AssertHelper::operator=(&local_4a8,(Message *)&local_4b0);
        testing::internal::AssertHelper::~AssertHelper(&local_4a8);
        if (local_4b0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_4b0._M_head_impl + 8))();
        }
      }
      puVar1 = local_498;
      if (local_498 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_498 != local_498 + 2) {
          operator_delete((undefined8 *)*local_498);
        }
        operator_delete(puVar1);
      }
      local_488.data_ = (AssertHelperData *)aom_codec_get_cx_data(&local_480,&local_490.data_);
      local_4b0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::internal::CmpHelperEQ<aom_codec_cx_pkt_const*,decltype(nullptr)>
                ((internal *)&local_4a0,"pkt","nullptr",(aom_codec_cx_pkt **)&local_488,
                 &local_4b0._M_head_impl);
      if (local_4a0.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_4b0);
        if (local_498 == (undefined8 *)0x0) {
          pSVar4 = "";
        }
        else {
          pSVar4 = (SEARCH_METHODS *)*local_498;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_4a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
                   ,0x891,(char *)pSVar4);
        testing::internal::AssertHelper::operator=(&local_4a8,(Message *)&local_4b0);
        testing::internal::AssertHelper::~AssertHelper(&local_4a8);
        if (local_4b0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_4b0._M_head_impl + 8))();
        }
      }
      puVar1 = local_498;
      if (local_498 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_498 != local_498 + 2) {
          operator_delete((undefined8 *)*local_498);
        }
        operator_delete(puVar1);
      }
      local_4b0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448;
      local_4a8.data_ =
           (AssertHelperData *)
           aom_img_wrap((aom_image_t *)local_448,AOM_IMG_FMT_I42016,4,2,1,
                        (uchar *)TestBody::kBuffer3);
      testing::internal::CmpHelperEQ<aom_image*,aom_image*>
                ((internal *)&local_4a0,"&img",
                 "aom_img_wrap(&img, AOM_IMG_FMT_I42016, kWidth, kHeight, 1, img_data3)",
                 (aom_image **)&local_4b0,(aom_image **)&local_4a8);
      if (local_4a0.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_4b0);
        if (local_498 == (undefined8 *)0x0) {
          pSVar4 = "";
        }
        else {
          pSVar4 = (SEARCH_METHODS *)*local_498;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_4a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
                   ,0x895,(char *)pSVar4);
        testing::internal::AssertHelper::operator=(&local_4a8,(Message *)&local_4b0);
        testing::internal::AssertHelper::~AssertHelper(&local_4a8);
        if ((aom_image_t *)local_4b0._M_head_impl != (aom_image_t *)0x0) {
          (**(code **)(*(long *)local_4b0._M_head_impl + 8))();
        }
      }
      puVar1 = local_498;
      if (local_498 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_498 != local_498 + 2) {
          operator_delete((undefined8 *)*local_498);
        }
        operator_delete(puVar1);
      }
      local_438 = 1;
      local_3ec[0] = 0;
      local_3ec[1] = 0;
      local_400 = (uchar *)0x0;
      puStack_3f8 = (uchar *)0x0;
      aVar3 = aom_codec_encode(&local_480,(aom_image_t *)local_448,0,1,0);
      local_4b0._M_head_impl._0_4_ = aVar3;
      local_4a8.data_ = local_4a8.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                ((internal *)&local_4a0,"aom_codec_encode(&enc, &img, 0, 1, 0)","AOM_CODEC_OK",
                 (aom_codec_err_t *)&local_4b0,(aom_codec_err_t *)&local_4a8);
      if (local_4a0.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_4b0);
        if (local_498 == (undefined8 *)0x0) {
          pSVar4 = "";
        }
        else {
          pSVar4 = (SEARCH_METHODS *)*local_498;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_4a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
                   ,0x899,(char *)pSVar4);
        testing::internal::AssertHelper::operator=(&local_4a8,(Message *)&local_4b0);
        testing::internal::AssertHelper::~AssertHelper(&local_4a8);
        if (local_4b0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_4b0._M_head_impl + 8))();
        }
      }
      puVar1 = local_498;
      if (local_498 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_498 != local_498 + 2) {
          operator_delete((undefined8 *)*local_498);
        }
        operator_delete(puVar1);
      }
      local_490.data_ = (AssertHelperData *)0x0;
      local_488.data_ = (AssertHelperData *)aom_codec_get_cx_data(&local_480,&local_490.data_);
      local_4b0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::internal::CmpHelperNE<aom_codec_cx_pkt_const*,decltype(nullptr)>
                ((internal *)&local_4a0,"pkt","nullptr",(aom_codec_cx_pkt **)&local_488,
                 &local_4b0._M_head_impl);
      puVar1 = local_498;
      if (local_4a0.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_4b0);
        if (local_498 == (undefined8 *)0x0) {
          pSVar4 = "";
        }
        else {
          pSVar4 = (SEARCH_METHODS *)*local_498;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_4a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
                   ,0x89c,(char *)pSVar4);
        testing::internal::AssertHelper::operator=(&local_4a8,(Message *)&local_4b0);
      }
      else {
        if (local_498 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_498 != local_498 + 2) {
            operator_delete((undefined8 *)*local_498);
          }
          operator_delete(puVar1);
        }
        local_4b0._M_head_impl = local_4b0._M_head_impl & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<aom_codec_cx_pkt_kind,aom_codec_cx_pkt_kind>
                  ((internal *)&local_4a0,"pkt->kind","AOM_CODEC_CX_FRAME_PKT",
                   &(local_488.data_)->type,(aom_codec_cx_pkt_kind *)&local_4b0);
        if (local_4a0.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_4b0);
          if (local_498 == (undefined8 *)0x0) {
            pSVar4 = "";
          }
          else {
            pSVar4 = (SEARCH_METHODS *)*local_498;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_4a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
                     ,0x89d,(char *)pSVar4);
          testing::internal::AssertHelper::operator=(&local_4a8,(Message *)&local_4b0);
          testing::internal::AssertHelper::~AssertHelper(&local_4a8);
          if (local_4b0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_4b0._M_head_impl + 8))();
          }
        }
        puVar1 = local_498;
        if (local_498 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_498 != local_498 + 2) {
            operator_delete((undefined8 *)*local_498);
          }
          operator_delete(puVar1);
        }
        local_4b0._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (CONCAT44(local_4b0._M_head_impl._4_4_,
                       *(undefined4 *)&((local_488.data_)->message).field_2) & 0xffffffff00000001);
        local_4a8.data_ = local_4a8.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)&local_4a0,"pkt->data.frame.flags & 0x1u","0u",(uint *)&local_4b0,
                   (uint *)&local_4a8);
        if (local_4a0.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_4b0);
          if (local_498 == (undefined8 *)0x0) {
            pSVar4 = "";
          }
          else {
            pSVar4 = (SEARCH_METHODS *)*local_498;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_4a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
                     ,0x89f,(char *)pSVar4);
          testing::internal::AssertHelper::operator=(&local_4a8,(Message *)&local_4b0);
          testing::internal::AssertHelper::~AssertHelper(&local_4a8);
          if (local_4b0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_4b0._M_head_impl + 8))();
          }
        }
        puVar1 = local_498;
        if (local_498 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_498 != local_498 + 2) {
            operator_delete((undefined8 *)*local_498);
          }
          operator_delete(puVar1);
        }
        local_488.data_ = (AssertHelperData *)aom_codec_get_cx_data(&local_480,&local_490.data_);
        local_4b0._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        testing::internal::CmpHelperEQ<aom_codec_cx_pkt_const*,decltype(nullptr)>
                  ((internal *)&local_4a0,"pkt","nullptr",(aom_codec_cx_pkt **)&local_488,
                   &local_4b0._M_head_impl);
        if (local_4a0.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_4b0);
          if (local_498 == (undefined8 *)0x0) {
            pSVar4 = "";
          }
          else {
            pSVar4 = (SEARCH_METHODS *)*local_498;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_4a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
                     ,0x8a1,(char *)pSVar4);
          testing::internal::AssertHelper::operator=(&local_4a8,(Message *)&local_4b0);
          testing::internal::AssertHelper::~AssertHelper(&local_4a8);
          if (local_4b0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_4b0._M_head_impl + 8))();
          }
        }
        puVar1 = local_498;
        if (local_498 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_498 != local_498 + 2) {
            operator_delete((undefined8 *)*local_498);
          }
          operator_delete(puVar1);
        }
        local_4b0._M_head_impl = local_4b0._M_head_impl & 0xffffffff00000000;
        aVar3 = aom_codec_encode(&local_480,(aom_image_t *)0x0,0,1,0);
        local_4a8.data_._0_4_ = aVar3;
        testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                  ((internal *)&local_4a0,"AOM_CODEC_OK","aom_codec_encode(&enc, nullptr, 0, 1, 0)",
                   (aom_codec_err_t *)&local_4b0,(aom_codec_err_t *)&local_4a8);
        if (local_4a0.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_4b0);
          if (local_498 == (undefined8 *)0x0) {
            pSVar4 = "";
          }
          else {
            pSVar4 = (SEARCH_METHODS *)*local_498;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_4a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
                     ,0x8a4,(char *)pSVar4);
          testing::internal::AssertHelper::operator=(&local_4a8,(Message *)&local_4b0);
          testing::internal::AssertHelper::~AssertHelper(&local_4a8);
          if (local_4b0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_4b0._M_head_impl + 8))();
          }
        }
        puVar1 = local_498;
        if (local_498 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_498 != local_498 + 2) {
            operator_delete((undefined8 *)*local_498);
          }
          operator_delete(puVar1);
        }
        local_490.data_ = (AssertHelperData *)0x0;
        local_488.data_ = (AssertHelperData *)aom_codec_get_cx_data(&local_480,&local_490.data_);
        local_4b0._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        testing::internal::CmpHelperEQ<aom_codec_cx_pkt_const*,decltype(nullptr)>
                  ((internal *)&local_4a0,"pkt","nullptr",(aom_codec_cx_pkt **)&local_488,
                   &local_4b0._M_head_impl);
        if (local_4a0.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_4b0);
          if (local_498 == (undefined8 *)0x0) {
            pSVar4 = "";
          }
          else {
            pSVar4 = (SEARCH_METHODS *)*local_498;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_4a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
                     ,0x8a7,(char *)pSVar4);
          testing::internal::AssertHelper::operator=(&local_4a8,(Message *)&local_4b0);
          testing::internal::AssertHelper::~AssertHelper(&local_4a8);
          if (local_4b0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_4b0._M_head_impl + 8))();
          }
        }
        puVar1 = local_498;
        if (local_498 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_498 != local_498 + 2) {
            operator_delete((undefined8 *)*local_498);
          }
          operator_delete(puVar1);
        }
        local_4b0._M_head_impl = local_4b0._M_head_impl & 0xffffffff00000000;
        aVar3 = aom_codec_destroy(&local_480);
        local_4a8.data_._0_4_ = aVar3;
        testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                  ((internal *)&local_4a0,"AOM_CODEC_OK","aom_codec_destroy(&enc)",
                   (aom_codec_err_t *)&local_4b0,(aom_codec_err_t *)&local_4a8);
        if (local_4a0.data_._0_1_ != (internal)0x0) goto LAB_007e67b5;
        testing::Message::Message((Message *)&local_4b0);
        if (local_498 == (undefined8 *)0x0) {
          pSVar4 = "";
        }
        else {
          pSVar4 = (SEARCH_METHODS *)*local_498;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_4a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/wiener_test.cc"
                   ,0x8a9,(char *)pSVar4);
        testing::internal::AssertHelper::operator=(&local_4a8,(Message *)&local_4b0);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_4a8);
  if (local_4b0._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_4b0._M_head_impl + 8))();
  }
LAB_007e67b5:
  if (local_498 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_498 != local_498 + 2) {
      operator_delete((undefined8 *)*local_498);
    }
    operator_delete(local_498);
  }
  return;
}

Assistant:

TEST(SearchWienerTest, DISABLED_12bitSignedIntegerOverflowInLinsolveWiener2) {
  constexpr int kWidth = 4;
  constexpr int kHeight = 2;
  static constexpr uint16_t kBuffer1[kWidth * kHeight] = {
    // Y plane:
    32, 4095, 2080, 2592, 32, 3104, 4095, 32,
  };
  unsigned char *img_data1 =
      reinterpret_cast<unsigned char *>(const_cast<uint16_t *>(kBuffer1));
  static constexpr uint16_t kBuffer2[kWidth * kHeight] = {
    // Y plane:
    4095, 4095, 2080, 4095, 4095, 32, 4095, 544,
  };
  unsigned char *img_data2 =
      reinterpret_cast<unsigned char *>(const_cast<uint16_t *>(kBuffer2));
  static constexpr uint16_t kBuffer3[kWidth * kHeight] = {
    // Y plane:
    3872, 3872, 3872, 2848, 800, 4095, 32, 3104,
  };
  unsigned char *img_data3 =
      reinterpret_cast<unsigned char *>(const_cast<uint16_t *>(kBuffer3));

  aom_codec_iface_t *iface = aom_codec_av1_cx();
  aom_codec_enc_cfg_t cfg;
  EXPECT_EQ(AOM_CODEC_OK,
            aom_codec_enc_config_default(iface, &cfg, AOM_USAGE_GOOD_QUALITY));
  cfg.rc_end_usage = AOM_Q;
  cfg.g_profile = 2;
  cfg.g_bit_depth = AOM_BITS_12;
  cfg.g_input_bit_depth = 12;
  cfg.g_w = kWidth;
  cfg.g_h = kHeight;
  cfg.g_lag_in_frames = 0;
  cfg.g_threads = 32;
  cfg.monochrome = 1;
  cfg.rc_min_quantizer = 51;
  cfg.rc_max_quantizer = 55;
  aom_codec_ctx_t enc;
  EXPECT_EQ(AOM_CODEC_OK,
            aom_codec_enc_init(&enc, iface, &cfg, AOM_CODEC_USE_HIGHBITDEPTH));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_control(&enc, AOME_SET_CQ_LEVEL, 53));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_control(&enc, AV1E_SET_TILE_ROWS, 3));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_control(&enc, AV1E_SET_TILE_COLUMNS, 6));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_control(&enc, AOME_SET_CPUUSED, 6));
  EXPECT_EQ(AOM_CODEC_OK,
            aom_codec_control(&enc, AV1E_SET_COLOR_RANGE, AOM_CR_FULL_RANGE));
  EXPECT_EQ(AOM_CODEC_OK,
            aom_codec_control(&enc, AOME_SET_TUNING, AOM_TUNE_SSIM));

  aom_image_t img;

  // Encode frame
  EXPECT_EQ(&img, aom_img_wrap(&img, AOM_IMG_FMT_I42016, kWidth, kHeight, 1,
                               img_data1));
  img.monochrome = 1;
  img.planes[1] = img.planes[2] = nullptr;
  img.stride[1] = img.stride[2] = 0;
  EXPECT_EQ(aom_codec_encode(&enc, &img, 0, 1, 0), AOM_CODEC_OK);
  aom_codec_iter_t iter = nullptr;
  const aom_codec_cx_pkt_t *pkt = aom_codec_get_cx_data(&enc, &iter);
  ASSERT_NE(pkt, nullptr);
  EXPECT_EQ(pkt->kind, AOM_CODEC_CX_FRAME_PKT);
  // pkt->data.frame.flags is 0x1f0011.
  EXPECT_EQ(pkt->data.frame.flags & AOM_FRAME_IS_KEY, AOM_FRAME_IS_KEY);
  pkt = aom_codec_get_cx_data(&enc, &iter);
  EXPECT_EQ(pkt, nullptr);

  // Encode frame
  EXPECT_EQ(&img, aom_img_wrap(&img, AOM_IMG_FMT_I42016, kWidth, kHeight, 1,
                               img_data2));
  img.monochrome = 1;
  img.planes[1] = img.planes[2] = nullptr;
  img.stride[1] = img.stride[2] = 0;
  EXPECT_EQ(aom_codec_encode(&enc, &img, 0, 1, 0), AOM_CODEC_OK);
  iter = nullptr;
  pkt = aom_codec_get_cx_data(&enc, &iter);
  ASSERT_NE(pkt, nullptr);
  EXPECT_EQ(pkt->kind, AOM_CODEC_CX_FRAME_PKT);
  // pkt->data.frame.flags is 0x20000.
  EXPECT_EQ(pkt->data.frame.flags & AOM_FRAME_IS_KEY, 0u);
  pkt = aom_codec_get_cx_data(&enc, &iter);
  EXPECT_EQ(pkt, nullptr);

  // Encode frame
  EXPECT_EQ(&img, aom_img_wrap(&img, AOM_IMG_FMT_I42016, kWidth, kHeight, 1,
                               img_data3));
  img.monochrome = 1;
  img.planes[1] = img.planes[2] = nullptr;
  img.stride[1] = img.stride[2] = 0;
  EXPECT_EQ(aom_codec_encode(&enc, &img, 0, 1, 0), AOM_CODEC_OK);
  iter = nullptr;
  pkt = aom_codec_get_cx_data(&enc, &iter);
  ASSERT_NE(pkt, nullptr);
  EXPECT_EQ(pkt->kind, AOM_CODEC_CX_FRAME_PKT);
  // pkt->data.frame.flags is 0x20000.
  EXPECT_EQ(pkt->data.frame.flags & AOM_FRAME_IS_KEY, 0u);
  pkt = aom_codec_get_cx_data(&enc, &iter);
  EXPECT_EQ(pkt, nullptr);

  // Flush encoder
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_encode(&enc, nullptr, 0, 1, 0));
  iter = nullptr;
  pkt = aom_codec_get_cx_data(&enc, &iter);
  EXPECT_EQ(pkt, nullptr);

  EXPECT_EQ(AOM_CODEC_OK, aom_codec_destroy(&enc));
}